

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ecf33::SymlinkTool::configureAttribute
          (SymlinkTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ConfigureContext *pCVar1;
  bool bVar2;
  bool local_2b1;
  Twine local_298;
  Twine local_280;
  Twine local_268;
  Twine local_250;
  Twine local_238;
  Twine local_220;
  char *local_208 [2];
  SymlinkTool *local_1f8;
  char *local_1f0;
  char *local_1e8 [2];
  SymlinkTool *local_1d8;
  char *local_1d0;
  char *local_1c8 [2];
  char *local_1b8;
  size_t local_1b0;
  ConfigureContext *local_1a8;
  ConfigureContext *ctx_local;
  SymlinkTool *this_local;
  StringRef value_local;
  StringRef name_local;
  SymlinkTool *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  SymlinkTool *local_120;
  char *local_118;
  char *local_110;
  size_t local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  char **local_e0;
  char *local_d8;
  size_t local_d0;
  SymlinkTool **local_c8;
  char *local_c0;
  char *local_b8;
  SymlinkTool **local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  SymlinkTool *local_88;
  int local_7c;
  char *local_78;
  char *local_70;
  SymlinkTool *local_68;
  int local_5c;
  size_t local_58;
  char *local_50;
  char *local_48;
  int local_3c;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (SymlinkTool *)value.Data;
  local_1b0 = name.Length;
  local_1b8 = name.Data;
  local_30 = local_1c8;
  local_38 = "repair-via-ownership-analysis";
  local_1c8[0] = "repair-via-ownership-analysis";
  local_1a8 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_1b8;
  local_108 = strlen("repair-via-ownership-analysis");
  local_f0 = local_1b8;
  local_e8 = local_1b0;
  local_100 = local_1c8[0];
  local_110 = local_1c8[0];
  local_d8 = local_1c8[0];
  local_e0 = &local_f0;
  local_2b1 = false;
  local_f8 = local_108;
  local_d0 = local_108;
  if (local_1b0 == local_108) {
    local_48 = local_1b8;
    local_50 = local_1c8[0];
    local_58 = local_108;
    if (local_108 == 0) {
      local_3c = 0;
    }
    else {
      local_3c = memcmp(local_1b8,local_1c8[0],local_108);
    }
    local_2b1 = local_3c == 0;
  }
  pCVar1 = local_1a8;
  if (local_2b1) {
    local_1d8 = this_local;
    local_1d0 = value_local.Data;
    local_20 = local_1e8;
    local_28 = "true";
    local_1e8[0] = "true";
    local_138 = (char *)strlen("true");
    local_120 = local_1d8;
    local_118 = local_1d0;
    local_130 = local_1e8[0];
    local_140 = local_1e8[0];
    local_c0 = local_1e8[0];
    local_c8 = &local_120;
    bVar2 = false;
    local_128 = local_138;
    local_b8 = local_138;
    if (local_1d0 == local_138) {
      local_68 = local_1d8;
      local_70 = local_1e8[0];
      local_78 = local_138;
      if (local_138 == (char *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = memcmp(local_1d8,local_1e8[0],(size_t)local_138);
      }
      bVar2 = local_5c == 0;
    }
    if (bVar2) {
      this->repairViaOwnershipAnalysis = true;
      name_local.Length._7_1_ = true;
    }
    else {
      local_1f8 = this_local;
      local_1f0 = value_local.Data;
      local_10 = local_208;
      local_18 = "false";
      local_208[0] = "false";
      local_a0 = (char *)strlen("false");
      local_150 = local_1f8;
      local_148 = local_1f0;
      local_a8 = local_208[0];
      local_b0 = &local_150;
      bVar2 = false;
      if (local_1f0 == local_a0) {
        local_88 = local_1f8;
        local_90 = local_208[0];
        local_98 = local_a0;
        if (local_a0 == (char *)0x0) {
          local_7c = 0;
        }
        else {
          local_7c = memcmp(local_1f8,local_208[0],(size_t)local_a0);
        }
        bVar2 = local_7c == 0;
      }
      pCVar1 = local_1a8;
      if (bVar2) {
        this->repairViaOwnershipAnalysis = false;
        name_local.Length._7_1_ = true;
      }
      else {
        llvm::operator+(&local_238,"invalid value for attribute: \'",
                        (StringRef *)&value_local.Length);
        llvm::Twine::Twine(&local_250,"\'");
        llvm::operator+(&local_220,&local_238,&local_250);
        llbuild::buildsystem::ConfigureContext::error(pCVar1,&local_220);
        name_local.Length._7_1_ = false;
      }
    }
  }
  else {
    llvm::operator+(&local_280,"unexpected attribute: \'",(StringRef *)&value_local.Length);
    llvm::Twine::Twine(&local_298,"\'");
    llvm::operator+(&local_268,&local_280,&local_298);
    llbuild::buildsystem::ConfigureContext::error(pCVar1,&local_268);
    name_local.Length._7_1_ = false;
  }
  return name_local.Length._7_1_;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if(value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }